

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FFontChar1::FFontChar1(FFontChar1 *this,FTexture *sourcelump)

{
  FTexture *sourcelump_local;
  FFontChar1 *this_local;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FFontChar1_009fd338;
  this->SourceRemap = (BYTE *)0x0;
  (this->super_FTexture).UseType = '\t';
  this->BaseTexture = sourcelump;
  if (this->BaseTexture != (FTexture *)0x0) {
    FTexture::CopySize(&this->super_FTexture,this->BaseTexture);
    this->Pixels = (BYTE *)0x0;
    return;
  }
  __assert_fail("BaseTexture != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                ,0x60d,"FFontChar1::FFontChar1(FTexture *)");
}

Assistant:

FFontChar1::FFontChar1 (FTexture *sourcelump)
: SourceRemap (NULL)
{
	UseType = FTexture::TEX_FontChar;
	BaseTexture = sourcelump;

	// now copy all the properties from the base texture
	assert(BaseTexture != NULL);
	CopySize(BaseTexture);
	Pixels = NULL;
}